

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O2

void sort_rd(int64_t *rds,int *txk,int len)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  lVar3 = 1;
  do {
    if (len <= lVar3) {
      return;
    }
    lVar2 = rds[lVar3];
    lVar4 = 0;
    while( true ) {
      if (lVar3 == lVar4) goto LAB_0021dc51;
      if (lVar2 < rds[lVar4]) break;
      lVar4 = lVar4 + 1;
    }
    iVar1 = txk[lVar3];
    for (lVar5 = lVar3; lVar4 < lVar5; lVar5 = lVar5 + -1) {
      rds[lVar5] = rds[lVar5 + -1];
      txk[lVar5] = txk[lVar5 + -1];
    }
    rds[lVar4] = lVar2;
    txk[lVar4] = iVar1;
LAB_0021dc51:
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

static inline void sort_rd(int64_t rds[], int txk[], int len) {
  int i, j, k;

  for (i = 1; i <= len - 1; ++i) {
    for (j = 0; j < i; ++j) {
      if (rds[j] > rds[i]) {
        int64_t temprd;
        int tempi;

        temprd = rds[i];
        tempi = txk[i];

        for (k = i; k > j; k--) {
          rds[k] = rds[k - 1];
          txk[k] = txk[k - 1];
        }

        rds[j] = temprd;
        txk[j] = tempi;
        break;
      }
    }
  }
}